

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport_p.h
# Opt level: O0

void __thiscall KDReports::HeaderMap::~HeaderMap(HeaderMap *this)

{
  Header *this_00;
  bool bVar1;
  Header **ppHVar2;
  iterator local_20;
  iterator local_18;
  iterator it;
  HeaderMap *this_local;
  
  it.i._M_node = (iterator)(iterator)this;
  local_18._M_node =
       (_Base_ptr)
       QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::begin
                 (&this->super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::end
                   (&this->super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>);
    bVar1 = ::operator!=((iterator *)&local_18,(iterator *)&local_20);
    if (!bVar1) break;
    ppHVar2 = QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::iterator::operator*
                        ((iterator *)&local_18);
    this_00 = *ppHVar2;
    if (this_00 != (Header *)0x0) {
      Header::~Header(this_00);
      operator_delete(this_00,8);
    }
    QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::iterator::operator++
              ((iterator *)&local_18);
  }
  QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::~QMap
            (&this->super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>);
  return;
}

Assistant:

~HeaderMap()
    {
        for (iterator it = begin(); it != end(); ++it) {
            delete *it;
        }
    }